

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OptimalControlProblem.cpp
# Opt level: O3

bool __thiscall
iDynTree::optimalcontrol::OptimalControlProblem::addLagrangeTerm
          (OptimalControlProblem *this,double weight,
          shared_ptr<iDynTree::optimalcontrol::QuadraticCost> *quadraticCost)

{
  OptimalControlProblemPimpl *this_00;
  bool bVar1;
  shared_ptr<iDynTree::optimalcontrol::Cost> local_60;
  double local_50;
  string local_48;
  TimeRange local_28;
  
  this_00 = this->m_pimpl;
  local_50 = weight;
  TimeRange::AnyTime();
  local_60.super___shared_ptr<iDynTree::optimalcontrol::Cost,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       (quadraticCost->
       super___shared_ptr<iDynTree::optimalcontrol::QuadraticCost,_(__gnu_cxx::_Lock_policy)2>).
       _M_ptr;
  local_60.super___shared_ptr<iDynTree::optimalcontrol::Cost,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi =
       (quadraticCost->
       super___shared_ptr<iDynTree::optimalcontrol::QuadraticCost,_(__gnu_cxx::_Lock_policy)2>).
       _M_refcount._M_pi;
  if (local_60.super___shared_ptr<iDynTree::optimalcontrol::Cost,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_60.super___shared_ptr<iDynTree::optimalcontrol::Cost,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi)->_M_use_count =
           (local_60.super___shared_ptr<iDynTree::optimalcontrol::Cost,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_60.super___shared_ptr<iDynTree::optimalcontrol::Cost,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi)->_M_use_count =
           (local_60.super___shared_ptr<iDynTree::optimalcontrol::Cost,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"addLagrangeTerm","");
  bVar1 = OptimalControlProblemPimpl::addCost
                    (this_00,local_50,&local_28,&local_60,false,true,&local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  if (local_60.super___shared_ptr<iDynTree::optimalcontrol::Cost,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_60.
               super___shared_ptr<iDynTree::optimalcontrol::Cost,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  return bVar1;
}

Assistant:

bool OptimalControlProblem::addLagrangeTerm(double weight, std::shared_ptr<QuadraticCost> quadraticCost)
        {
            return (m_pimpl->addCost(weight, TimeRange::AnyTime(), quadraticCost, false, true, "addLagrangeTerm"));
        }